

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O3

int internal_write_event
              (CMConnection conn,CMFormat format,void *remote_path_id,int path_len,event_item *event
              ,attr_list attrs,size_t *event_len_p)

{
  CManager cm;
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  undefined8 uVar4;
  FFSEncodeVec *pFVar5;
  FILE *pFVar6;
  size_t sVar7;
  size_t __size;
  char *pcVar8;
  FFSEncodeVec *pFVar9;
  event_item *byte_count;
  ulong uVar10;
  long vec_count;
  size_t sVar11;
  int attr_len;
  int header [4];
  timespec ts_3;
  timespec ts;
  uint local_6d4;
  FFSEncodeVec *local_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  FFSEncodeVec *local_6b8;
  void *local_6b0;
  timespec local_6a8;
  FFSEncodeVec local_698;
  undefined8 local_688;
  undefined8 uStack_680;
  FFSEncodeVec local_678 [100];
  
  local_6d4 = 0;
  cm = conn->cm;
  if (conn->closed == 0) {
    if (conn->failed != 0) {
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar1 = CMtrace_init(cm,CMDataVerbose);
        if (iVar1 != 0) goto LAB_00120375;
      }
      else if (CMtrace_val[4] != 0) {
LAB_00120375:
        if (CMtrace_PID != 0) {
          pFVar6 = (FILE *)conn->cm->CMTrace_file;
          _Var2 = getpid();
          pVar3 = pthread_self();
          fprintf(pFVar6,"P%lxT%lx - ",(long)_Var2,pVar3);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)local_678);
          fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_678[0].iov_base,
                  local_678[0].iov_len);
        }
        pFVar6 = (FILE *)conn->cm->CMTrace_file;
        pcVar8 = "Not writing data to failed connection\n";
        goto LAB_00120400;
      }
      goto LAB_0012040f;
    }
    byte_count = event;
    local_6d0 = (FFSEncodeVec *)remote_path_id;
    if (conn->write_pending != 0) {
      wait_for_pending_write(conn);
    }
    if (format->registration_pending != 0) {
      CMcomplete_format_registration(format,1);
    }
    if (format->fmformat == (FMFormat)0x0) {
      printf("Format registration has failed for format \"%s\" - write aborted\n",
             format->format_name);
      return 0;
    }
    CMformat_preload(conn,format);
    iVar1 = CMtrace_val[4];
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar1 = CMtrace_init(conn->cm,CMDataVerbose);
    }
    if (iVar1 != 0) {
      if (internal_write_event_size_set == '\0') {
        pcVar8 = getenv("CMDumpSize");
        internal_write_event_size_set = '\x01';
        if (pcVar8 != (char *)0x0) {
          internal_write_event::dump_char_limit = atoi(pcVar8);
        }
      }
      pFVar6 = (FILE *)cm->CMTrace_file;
      uVar4 = name_of_FMformat(format->fmformat);
      fprintf(pFVar6,"CM - Writing EVENT record %p of type %s\n",event,uVar4);
      if (attrs == (attr_list)0x0) {
        fwrite("CM - write attrs NULL\n",0x16,1,(FILE *)cm->CMTrace_file);
      }
      else {
        fwrite("CM - write attributes are:",0x1a,1,(FILE *)cm->CMTrace_file);
        fdump_attr_list(cm->CMTrace_file,attrs);
      }
      pFVar6 = (FILE *)cm->CMTrace_file;
      uVar4 = name_of_FMformat(format->fmformat);
      fprintf(pFVar6,"CM - record type %s, contents ",uVar4);
      if (event->decoded_event == (void *)0x0) {
        fwrite("ENCODED are:\n  ",0xf,1,(FILE *)cm->CMTrace_file);
        iVar1 = FMfdump_encoded_data
                          (cm->CMTrace_file,format->fmformat,event->encoded_event,
                           internal_write_event::dump_char_limit);
      }
      else {
        fwrite("DECODED are:\n  ",0xf,1,(FILE *)cm->CMTrace_file);
        iVar1 = FMfdump_data(cm->CMTrace_file,format->fmformat,event->decoded_event,
                             internal_write_event::dump_char_limit);
      }
      if (iVar1 == 0 && internal_write_event::warned == 0) {
        fwrite("\n\n  ****  Warning **** CM record dump truncated\n",0x30,1,(FILE *)cm->CMTrace_file
              );
        fwrite("  To change size limits, set CMDumpSize environment variable.\n",0x3e,1,
               (FILE *)cm->CMTrace_file);
        internal_write_event::warned = internal_write_event::warned + 1;
      }
      fwrite("\n=======\n",9,1,(FILE *)cm->CMTrace_file);
    }
    if (event->encoded_event == (void *)0x0) {
      local_6b8 = (FFSEncodeVec *)
                  FFSencode_vector(conn->io_out_buffer,format->fmformat,event->decoded_event);
      if (local_6b8->iov_base == (void *)0x0) {
        sVar11 = 0;
        uVar10 = 0;
      }
      else {
        uVar10 = 0;
        sVar11 = 0;
        pFVar5 = local_6b8;
        do {
          pFVar9 = pFVar5 + 1;
          uVar10 = uVar10 + 1;
          sVar11 = sVar11 + pFVar5->iov_len;
          pFVar5 = pFVar9;
        } while (pFVar9->iov_base != (void *)0x0);
      }
    }
    else {
      local_6b8 = &local_698;
      sVar11 = event->event_len;
      local_688 = 0;
      uStack_680 = 0;
      uVar10 = 1;
      local_698.iov_base = event->encoded_event;
      local_698.iov_len = sVar11;
    }
    if (attrs == (attr_list)0x0) {
      local_6b0 = (void *)0x0;
    }
    else {
      local_6b0 = (void *)encode_attr_for_xmit(attrs,conn->attr_encode_buffer,&local_6d4);
      local_6d4 = local_6d4 + 7 & 0xfffffff8;
    }
    iVar1 = CMtrace_val[4];
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar1 = CMtrace_init(conn->cm,CMDataVerbose);
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        pFVar6 = (FILE *)conn->cm->CMTrace_file;
        _Var2 = getpid();
        pVar3 = pthread_self();
        fprintf(pFVar6,"P%lxT%lx - ",(long)_Var2,pVar3);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)local_678);
        fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_678[0].iov_base,
                local_678[0].iov_len);
      }
      fprintf((FILE *)conn->cm->CMTrace_file,
              "CM - Total write size is %zd bytes data + %d bytes attrs\n",sVar11,(ulong)local_6d4);
    }
    fflush((FILE *)conn->cm->CMTrace_file);
    if ((cm_write_hook == (_func_int_size_t *)0x0) || (iVar1 = (*cm_write_hook)(sVar11), iVar1 != 0)
       ) {
      local_6c8 = 0x434d4c00;
      uStack_6c0 = 0;
      if (uVar10 < 100) {
        pFVar5 = local_678;
      }
      else {
        pFVar5 = (FFSEncodeVec *)INT_CMmalloc(uVar10 * 0x10 + 0x30);
      }
      local_6c8._4_4_ = (undefined4)sVar11;
      if (path_len == 4) {
        local_6c8 = CONCAT44(local_6c8._4_4_,0x434d4c00);
        uStack_6c0._4_4_ = *(uint *)&local_6d0->iov_base;
        pFVar9 = pFVar5;
        sVar7 = sVar11;
        if (attrs == (attr_list)0x0) goto LAB_00120976;
LAB_00120824:
        pFVar5->iov_base = &local_6c8;
        pFVar5->iov_len = 0x10;
        pFVar5[1].iov_base = local_6b0;
        sVar7 = (size_t)(int)local_6d4;
        uStack_6c0 = CONCAT44(uStack_6c0._4_4_,local_6d4);
        pFVar5[1].iov_len = sVar7;
        memcpy(pFVar5 + 2,local_6b8,uVar10 << 4);
        vec_count = uVar10 + 2;
        iVar1 = CMtrace_val[3];
        if (conn->cm->CMTrace_file == (FILE *)0x0) {
          iVar1 = CMtrace_init(conn->cm,CMLowLevelVerbose);
        }
        if (iVar1 != 0) {
          local_6d0 = pFVar5;
          if (CMtrace_PID != 0) {
            pFVar6 = (FILE *)conn->cm->CMTrace_file;
            _Var2 = getpid();
            pVar3 = pthread_self();
            fprintf(pFVar6,"P%lxT%lx - ",(long)_Var2,pVar3);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_6a8);
            fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_6a8.tv_sec,
                    local_6a8.tv_nsec);
          }
          fprintf((FILE *)conn->cm->CMTrace_file,
                  "Writing %lu vectors, total %zu bytes (including attrs) in writev\n",vec_count,
                  sVar11 + sVar7 + 0x10);
          pFVar5 = local_6d0;
        }
        fflush((FILE *)conn->cm->CMTrace_file);
      }
      else {
        uStack_6c0._4_4_ = path_len + 7U & 0xfffffff8;
        local_6c8 = CONCAT44(local_6c8._4_4_,0x434d4700);
        if (attrs != (attr_list)0x0) goto LAB_00120824;
        pFVar5[1].iov_base = local_6d0;
        pFVar5[1].iov_len = (long)(int)uStack_6c0._4_4_;
        pFVar9 = pFVar5 + 1;
        sVar7 = (long)(int)uStack_6c0._4_4_ + sVar11;
LAB_00120976:
        uStack_6c0 = (ulong)uStack_6c0._4_4_ << 0x20;
        pFVar5->iov_base = &local_6c8;
        pFVar5->iov_len = 0x10;
        local_6d0 = pFVar5;
        memcpy(pFVar9 + 1,local_6b8,uVar10 << 4);
        vec_count = uVar10 + 1;
        iVar1 = CMtrace_val[3];
        if (conn->cm->CMTrace_file == (FILE *)0x0) {
          iVar1 = CMtrace_init(conn->cm,CMLowLevelVerbose);
        }
        if (iVar1 != 0) {
          if (CMtrace_PID != 0) {
            pFVar6 = (FILE *)conn->cm->CMTrace_file;
            _Var2 = getpid();
            pVar3 = pthread_self();
            fprintf(pFVar6,"P%lxT%lx - ",(long)_Var2,pVar3);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_6a8);
            fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_6a8.tv_sec,
                    local_6a8.tv_nsec);
          }
          fprintf((FILE *)conn->cm->CMTrace_file,"Writing %lu vectors, total %zu bytes in writev\n",
                  vec_count,sVar7 + 0x10);
        }
        fflush((FILE *)conn->cm->CMTrace_file);
        pFVar5 = local_6d0;
      }
      iVar1 = INT_CMwrite_raw_notify
                        (conn,pFVar5,local_6b8,vec_count,(size_t)byte_count,attrs,
                         (uint)(local_6b8 == &local_698),(CMcompletion_notify_func)0x0,(void *)0x0);
      if (pFVar5 != local_678) {
        INT_CMfree(pFVar5);
      }
      if (iVar1 == 0) {
        iVar1 = CMtrace_val[7];
        if (conn->cm->CMTrace_file == (FILE *)0x0) {
          iVar1 = CMtrace_init(conn->cm,CMFreeVerbose);
        }
        if (iVar1 != 0) {
          if (CMtrace_PID != 0) {
            pFVar6 = (FILE *)conn->cm->CMTrace_file;
            _Var2 = getpid();
            pVar3 = pthread_self();
            fprintf(pFVar6,"P%lxT%lx - ",(long)_Var2,pVar3);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_6a8);
            fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_6a8.tv_sec,
                    local_6a8.tv_nsec);
          }
          fprintf((FILE *)conn->cm->CMTrace_file,
                  "Calling connection (write failed) failed with dereference %p\n",conn);
        }
        fflush((FILE *)conn->cm->CMTrace_file);
        INT_CMConnection_failed(conn);
        iVar1 = CMtrace_val[3];
        if (conn->cm->CMTrace_file == (FILE *)0x0) {
          iVar1 = CMtrace_init(conn->cm,CMLowLevelVerbose);
        }
        if (iVar1 != 0) {
          if (CMtrace_PID != 0) {
            pFVar6 = (FILE *)conn->cm->CMTrace_file;
            _Var2 = getpid();
            pVar3 = pthread_self();
            fprintf(pFVar6,"P%lxT%lx - ",(long)_Var2,pVar3);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_6a8);
            fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_6a8.tv_sec,
                    local_6a8.tv_nsec);
          }
          pFVar6 = (FILE *)conn->cm->CMTrace_file;
          pcVar8 = "Writev failed\n";
          __size = 0xe;
          goto LAB_00120405;
        }
        goto LAB_0012040f;
      }
    }
    if (event_len_p != (size_t *)0x0) {
      *event_len_p = sVar11;
    }
    iVar1 = CMtrace_val[3];
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar1 = CMtrace_init(conn->cm,CMLowLevelVerbose);
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        pFVar6 = (FILE *)conn->cm->CMTrace_file;
        _Var2 = getpid();
        pVar3 = pthread_self();
        fprintf(pFVar6,"P%lxT%lx - ",(long)_Var2,pVar3);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)local_678);
        fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_678[0].iov_base,
                local_678[0].iov_len);
      }
      fwrite("Writev success\n",0xf,1,(FILE *)conn->cm->CMTrace_file);
    }
    fflush((FILE *)conn->cm->CMTrace_file);
    iVar1 = 1;
  }
  else {
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar1 = CMtrace_init(cm,CMDataVerbose);
      if (iVar1 != 0) goto LAB_00120257;
    }
    else if (CMtrace_val[4] != 0) {
LAB_00120257:
      if (CMtrace_PID != 0) {
        pFVar6 = (FILE *)conn->cm->CMTrace_file;
        _Var2 = getpid();
        pVar3 = pthread_self();
        fprintf(pFVar6,"P%lxT%lx - ",(long)_Var2,pVar3);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)local_678);
        fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_678[0].iov_base,
                local_678[0].iov_len);
      }
      pFVar6 = (FILE *)conn->cm->CMTrace_file;
      pcVar8 = "Not writing data to closed connection\n";
LAB_00120400:
      __size = 0x26;
LAB_00120405:
      fwrite(pcVar8,__size,1,pFVar6);
    }
LAB_0012040f:
    fflush((FILE *)conn->cm->CMTrace_file);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

extern int
 internal_write_event(CMConnection conn, CMFormat format, void *remote_path_id,
		      int path_len, event_item *event, attr_list attrs, size_t *event_len_p)
 {
     FFSEncodeVector vec;
     struct FFSEncodeVec preencoded_vec[2];
     size_t data_length = 0, actual;
     long vec_count = 0;
     int attr_len = 0;
     int do_write = 1;
     void *encoded_attrs = NULL;
     int attrs_present = 0;
     CManager cm = conn->cm;

     /* ensure conn is open */
     if (conn->closed != 0) {
	 CMtrace_out(conn->cm, CMDataVerbose, "Not writing data to closed connection\n");
	 return 0;
     }
     if (conn->failed != 0) {
	 CMtrace_out(conn->cm, CMDataVerbose, "Not writing data to failed connection\n");
	 return 0;
     }
     if (conn->write_pending) {
	 wait_for_pending_write(conn);
     }
     if (format->registration_pending) {
	 CMcomplete_format_registration(format, 1);
     }
     if (format->fmformat == NULL) {
	 printf("Format registration has failed for format \"%s\" - write aborted\n",
		format->format_name);
	 return 0;
     }
     CMformat_preload(conn, format);

     if (CMtrace_on(conn->cm, CMDataVerbose)) {
	 static int dump_char_limit = 256;
	 static int warned = 0;
	 static int size_set = 0;
	 int r;
	 if (size_set == 0) {
	     char *size_str = getenv("CMDumpSize");
	     size_set++;
	     if (size_str != NULL) {
		 dump_char_limit = atoi(size_str);
	     }
	 }
	 fprintf(cm->CMTrace_file, "CM - Writing EVENT record %p of type %s\n", event,
		name_of_FMformat(format->fmformat));
	 if (attrs != NULL) {
	     fprintf(cm->CMTrace_file, "CM - write attributes are:");
	     fdump_attr_list(cm->CMTrace_file, attrs);
	 } else {
	     fprintf(cm->CMTrace_file, "CM - write attrs NULL\n");
	 }
	 fprintf(cm->CMTrace_file, "CM - record type %s, contents ", name_of_FMformat(format->fmformat));
	 if (event->decoded_event) {
	     fprintf(cm->CMTrace_file, "DECODED are:\n  ");
	     r = FMfdump_data(cm->CMTrace_file, format->fmformat, event->decoded_event,
			      dump_char_limit);
	 } else {
	     fprintf(cm->CMTrace_file, "ENCODED are:\n  ");
	     r = FMfdump_encoded_data(cm->CMTrace_file, format->fmformat,
				      event->encoded_event, dump_char_limit);
	 }	    
	 if (!r && !warned) {
	     fprintf(cm->CMTrace_file, "\n\n  ****  Warning **** CM record dump truncated\n");
	     fprintf(cm->CMTrace_file, "  To change size limits, set CMDumpSize environment variable.\n");
	     warned++;
	 }
	 fprintf(cm->CMTrace_file, "\n=======\n");
     }

     if (!event->encoded_event) {
	 /* encode data with CM context */
	 vec = FFSencode_vector(conn->io_out_buffer,
				format->fmformat, event->decoded_event);
	 while(vec[vec_count].iov_base != NULL) {
	     data_length += vec[vec_count].iov_len;
	     vec_count++;
	 }
     } else {
	 vec = &preencoded_vec[0];
	 preencoded_vec[0].iov_base = event->encoded_event;
	 preencoded_vec[0].iov_len = event->event_len;
	 preencoded_vec[1].iov_base = NULL;
	 preencoded_vec[1].iov_len = 0;
	 vec_count = 1;
	 data_length = event->event_len;
     }
     if (attrs != NULL) {
	 attrs_present++;
	 encoded_attrs = encode_attr_for_xmit(attrs, conn->attr_encode_buffer,
					      &attr_len);
	 attr_len = (attr_len +7) & -8;  /* round up to even 8 */
     }
     CMtrace_out(conn->cm, CMDataVerbose, "CM - Total write size is %zd bytes data + %d bytes attrs\n", data_length, attr_len);
     if (cm_write_hook != NULL) {
	 do_write = cm_write_hook(data_length);
     }
     if (do_write) {
	 struct FFSEncodeVec static_vec[100];
	 FFSEncodeVector tmp_vec = &static_vec[0];
	 size_t byte_count = data_length;/* sum lengths */
	 int header[4] = {0x434d4C00, 0, 0, 0};  /* CML\0 in first entry */
	 if (vec_count >= sizeof(static_vec)/ sizeof(static_vec[0])) {
	     tmp_vec = INT_CMmalloc((vec_count+3) * sizeof(*tmp_vec));
	 }
	 header[1] = (int)data_length;
	 if (path_len != 4) {
	     header[0] = 0x434d4700;
	     header[3] = (path_len + 7) & -8;
	 } else {
	     header[0] = 0x434d4C00;  /* 4 byte chan ID */
	     header[3] = *((int*)remote_path_id);
	 }
	 if (attrs == NULL) {
	     FFSEncodeVector assign_vec = tmp_vec;
	     header[2] = 0;
	     if (path_len != 4) {
		 tmp_vec[1].iov_base = remote_path_id;
		 tmp_vec[1].iov_len = (path_len + 7) & -8;
		 byte_count += tmp_vec[1].iov_len;
		 assign_vec++;
	     }
	     tmp_vec[0].iov_base = &header;
	     tmp_vec[0].iov_len = sizeof(header);
	     memcpy(&assign_vec[1], vec, sizeof(*tmp_vec) * vec_count);
	     vec_count++;
	     byte_count += sizeof(header);
	     CMtrace_out(conn->cm, CMLowLevelVerbose, 
			 "Writing %lu vectors, total %zu bytes in writev\n", 
			 vec_count, byte_count);
	 } else {
	     tmp_vec[0].iov_base = &header;
	     tmp_vec[0].iov_len = sizeof(header);
	     tmp_vec[1].iov_base = encoded_attrs;
	     header[2] = attr_len;
	     tmp_vec[1].iov_len = attr_len;
	     memcpy(&tmp_vec[2], vec, sizeof(*tmp_vec) * vec_count);
	     byte_count += sizeof(header) + header[2];
	     vec_count += 2;
	     CMtrace_out(conn->cm, CMLowLevelVerbose, 
			 "Writing %lu vectors, total %zu bytes (including attrs) in writev\n", 
			 vec_count, byte_count);
	 }
	 actual = INT_CMwrite_raw(conn, tmp_vec, vec, vec_count, byte_count, attrs,
				     vec == &preencoded_vec[0]);
	 if (tmp_vec != &static_vec[0]) {
	     INT_CMfree(tmp_vec);
	 }
	 if (actual <= 0) {
	     /* fail */
	     CMtrace_out(conn->cm, CMFreeVerbose, "Calling connection (write failed) failed with dereference %p\n", conn);
	     INT_CMConnection_failed(conn);
	     CMtrace_out(conn->cm, CMLowLevelVerbose, 
			 "Writev failed\n");
	     return 0;
	 }
     }
     if (event_len_p) *event_len_p = data_length;
     CMtrace_out(conn->cm, CMLowLevelVerbose, "Writev success\n");
     return 1;
 }